

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O3

void __thiscall FNodeBuilder::MakeSegsFromSides(FNodeBuilder *this)

{
  FPrivSeg *pFVar1;
  int iVar2;
  DWORD DVar3;
  FLevel *pFVar4;
  long lVar5;
  ulong uVar6;
  
  pFVar4 = this->Level;
  iVar2 = pFVar4->NumLines;
  if (iVar2 == 0) {
    I_Error("Map is empty.\n");
    pFVar4 = this->Level;
    iVar2 = pFVar4->NumLines;
  }
  if (0 < iVar2) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (*(long *)((long)pFVar4->Lines->sidedef + lVar5) == 0) {
        Printf("Linedef %d does not have a front side.\n",uVar6 & 0xffffffff);
      }
      else {
        CreateSeg(this,(int)uVar6,0);
      }
      pFVar4 = this->Level;
      if (*(long *)((long)pFVar4->Lines->sidedef + lVar5 + 8) != 0) {
        DVar3 = CreateSeg(this,(int)uVar6,1);
        pFVar4 = this->Level;
        if (*(long *)((long)pFVar4->Lines->sidedef + lVar5) != 0) {
          pFVar1 = (this->Segs).Array;
          pFVar1[(int)(DVar3 - 1)].partner = DVar3;
          pFVar1[(int)DVar3].partner = DVar3 - 1;
        }
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x98;
    } while ((long)uVar6 < (long)pFVar4->NumLines);
  }
  return;
}

Assistant:

void FNodeBuilder::MakeSegsFromSides ()
{
	int i, j;

	if (Level.NumLines == 0)
	{
		I_Error ("Map is empty.\n");
	}

	for (i = 0; i < Level.NumLines; ++i)
	{
		if (Level.Lines[i].sidedef[0] != NULL)
		{
			CreateSeg (i, 0);
		}
		else
		{
			Printf ("Linedef %d does not have a front side.\n", i);
		}

		if (Level.Lines[i].sidedef[1] != NULL)
		{
			j = CreateSeg (i, 1);
			if (Level.Lines[i].sidedef[0] != NULL)
			{
				Segs[j-1].partner = j;
				Segs[j].partner = j-1;
			}
		}
	}
}